

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O3

void Of_ManComputeBackward1(Of_Man_t *p)

{
  uint *puVar1;
  int iVar2;
  int iVar3;
  Jf_Par_t *pJVar4;
  Gia_Obj_t *pGVar5;
  undefined8 uVar6;
  Of_Obj_t *pOVar7;
  void *pvVar8;
  bool bVar9;
  uint uVar10;
  int iVar11;
  ulong uVar12;
  long lVar13;
  uint *puVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  uint uVar18;
  int iVar19;
  word wVar20;
  int iVar21;
  ulong uVar22;
  uint *puVar23;
  word wVar24;
  
  iVar2 = p->pPars->nDelayLut1;
  Of_ManComputeOutputRequired(p,1);
  pJVar4 = p->pPars;
  pJVar4->Area = 0;
  pJVar4->Edge = 0;
  lVar16 = (long)p->pGia->nObjs;
  if (1 < lVar16) {
    pGVar5 = p->pGia->pObjs;
    wVar20 = 0;
    wVar24 = 0;
    do {
      if (pGVar5 == (Gia_Obj_t *)0x0) {
        return;
      }
      lVar17 = lVar16 + -1;
      uVar6 = *(undefined8 *)(pGVar5 + lVar17);
      uVar18 = (uint)uVar6;
      if ((~uVar18 & 0x1fffffff) != 0 && -1 < (int)uVar18) {
        pOVar7 = p->pObjs;
        iVar21 = pOVar7[lVar17].Required;
        if (((uVar18 & 0x1fffffff) == 0x1fffffff) ||
           ((uVar18 & 0x1fffffff) != ((uint)((ulong)uVar6 >> 0x20) & 0x1fffffff))) {
          if (pOVar7[lVar17].nRefs != 0) {
            if ((p->vCutSets).nSize < lVar16) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecInt.h"
                            ,0x19e,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            uVar18 = (p->vCutSets).pArray[lVar17];
            uVar10 = (int)uVar18 >> 0x10;
            if (((int)uVar10 < 0) || ((p->vPages).nSize <= (int)uVar10)) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                            ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
            }
            pvVar8 = (p->vPages).pArray[uVar10];
            iVar3 = *(int *)((long)pvVar8 + ((ulong)uVar18 & 0xffff) * 4);
            if (iVar3 < 1) {
LAB_0073f466:
              __assert_fail("pCutMin != NULL",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                            ,0x4b2,"void Of_ManComputeBackward1(Of_Man_t *)");
            }
            puVar1 = (uint *)((long)pvVar8 + ((ulong)uVar18 & 0xffff) * 4);
            puVar14 = puVar1 + 1;
            iVar19 = 1000000000;
            iVar11 = 0;
            puVar23 = (uint *)0x0;
            do {
              uVar12 = (ulong)(*puVar14 & 0x1f);
              if ((int)puVar14[uVar12 + 1] <= iVar21) {
                if ((*puVar14 & 0x1f) == 0) {
                  iVar15 = 0;
                }
                else {
                  uVar22 = 0;
                  iVar15 = 0;
                  do {
                    uVar10 = puVar14[uVar22 + 1];
                    if ((int)uVar10 < 0) goto LAB_0073f428;
                    if (uVar10 < 2) break;
                    if (pOVar7[uVar10 >> 1].nRefs == 0) {
                      iVar15 = iVar15 + pOVar7[uVar10 >> 1].Flow;
                    }
                    uVar22 = uVar22 + 1;
                  } while (uVar12 != uVar22);
                }
                if (iVar15 < iVar19) {
                  puVar23 = puVar14;
                }
                if (iVar15 <= iVar19) {
                  iVar19 = iVar15;
                }
              }
              iVar11 = iVar11 + 1;
              puVar14 = puVar14 + uVar12 + 4;
            } while (iVar11 != iVar3);
            if (puVar23 == (uint *)0x0) goto LAB_0073f466;
            if (puVar23 < puVar1 || (long)puVar23 - (long)puVar1 == 0) {
              __assert_fail("pCut > pCutSet",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                            ,0x6c,"int Of_CutHandle(int *, int *)");
            }
            pOVar7[lVar17].iCutH = (int)((ulong)((long)puVar23 - (long)puVar1) >> 2) + uVar18;
            uVar12 = (ulong)(*puVar23 & 0x1f);
            if ((*puVar23 & 0x1f) == 0) {
              uVar12 = 0;
            }
            else {
              iVar21 = iVar21 - iVar2;
              uVar22 = 0;
              do {
                uVar18 = puVar23[uVar22 + 1];
                if ((int)uVar18 < 0) {
LAB_0073f428:
                  __assert_fail("Lit >= 0",
                                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                                ,0xf2,"int Abc_Lit2Var(int)");
                }
                if (uVar18 < 2) break;
                uVar18 = uVar18 >> 1;
                if (iVar21 < pOVar7[uVar18].Required) {
                  pOVar7[uVar18].Required = iVar21;
                }
                pOVar7[uVar18].nRefs = pOVar7[uVar18].nRefs + 1;
                uVar22 = uVar22 + 1;
                uVar12 = (ulong)(*puVar23 & 0x1f);
              } while (uVar22 < uVar12);
            }
            wVar24 = wVar24 + uVar12;
            pJVar4->Edge = wVar24;
            wVar20 = wVar20 + 1;
            pJVar4->Area = wVar20;
          }
        }
        else {
          lVar13 = lVar17 - (ulong)(uVar18 & 0x1fffffff);
          if (iVar21 < pOVar7[lVar13].Required) {
            pOVar7[lVar13].Required = iVar21;
          }
          pOVar7[lVar13].nRefs = pOVar7[lVar13].nRefs + 1;
        }
      }
      bVar9 = 2 < lVar16;
      lVar16 = lVar17;
    } while (bVar9);
  }
  return;
}

Assistant:

void Of_ManComputeBackward1( Of_Man_t * p )
{
    Gia_Obj_t * pObj; 
    int DelayLut1 = p->pPars->nDelayLut1;
    int i, k, iVar, * pList, * pCut, * pCutMin;
    Of_ManComputeOutputRequired( p, 1 );
    // compute area and edges
    p->pPars->Area = p->pPars->Edge = 0;
    Gia_ManForEachAndReverse( p->pGia, pObj, i )
    {
        int CostMin, Cost, Required = Of_ObjRequired(p, i);
        if ( Gia_ObjIsBuf(pObj) )
        {
            int FaninId = Gia_ObjFaninId0(pObj, i);
            Of_ObjUpdateRequired( p, FaninId, Required );
            Of_ObjRefInc( p, FaninId );
            continue;
        }
        if ( !Of_ObjRefNum(p, i) )
            continue;
        // select the best cut
        pCutMin = NULL;
        CostMin = ABC_INFINITY;
        pList = Of_ObjCutSet( p, i );
        Of_SetForEachCut( pList, pCut, k )
        {
            if ( Of_CutDelay1(pCut) > Required )
                continue;
            Cost = Of_ManComputeBackwardCut( p, pCut );
            if ( CostMin > Cost )
            {
                CostMin = Cost;
                pCutMin = pCut;
            }
        }
        // the cut is selected
        assert( pCutMin != NULL );
        Of_ObjSetCutBestP( p, pList, i, pCutMin );
        Of_CutForEachVar( pCutMin, iVar, k )
        {
            Of_ObjUpdateRequired( p, iVar, Required - DelayLut1 );
            Of_ObjRefInc( p, iVar );
        }
        // update parameters
        p->pPars->Edge += Of_CutSize(pCutMin);
        p->pPars->Area++;
    }
}